

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O0

float deqp::gles3::Functional::safeCoord(float raw,int scale,float fraction)

{
  float fVar1;
  float scaleFloat;
  float fraction_local;
  int scale_local;
  float raw_local;
  
  fVar1 = moveTowardsFraction(raw * (float)scale,fraction);
  return fVar1 / (float)scale;
}

Assistant:

static inline float safeCoord (float raw, int scale, float fraction)
{
	const float scaleFloat = (float)scale;
	return moveTowardsFraction(raw*scaleFloat, fraction) / scaleFloat;
}